

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::QuadraticCost::setStateHessianSparsity
          (QuadraticCost *this,SparsityStructure *stateSparsity)

{
  bool bVar1;
  
  bVar1 = SparsityStructure::isValid(stateSparsity);
  if (bVar1) {
    (this->super_QuadraticLikeCost).m_hasSecondPartialDerivativeWRTStateSparsity = true;
    SparsityStructure::operator=
              (&(this->super_QuadraticLikeCost).m_secondPartialDerivativeWRTStateSparsity,
               stateSparsity);
  }
  else {
    iDynTree::reportError
              ("QuadraticCost","setStateHessianSparsity",
               "The sparsity vectors have different number of entries.");
  }
  return bVar1;
}

Assistant:

bool iDynTree::optimalcontrol::QuadraticCost::setStateHessianSparsity(const SparsityStructure &stateSparsity)
        {
            if (!stateSparsity.isValid()) {
                reportError("QuadraticCost", "setStateHessianSparsity", "The sparsity vectors have different number of entries.");
                return false;
            }
            m_hasSecondPartialDerivativeWRTStateSparsity = true;
            m_secondPartialDerivativeWRTStateSparsity = stateSparsity;
            return true;
        }